

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::DirectoryStructureInputNodeTask::start
          (DirectoryStructureInputNodeTask *this,TaskInterface ti)

{
  BuildNode *pBVar1;
  BuildKey *this_00;
  char *pcVar2;
  StringList *in_R8;
  StringRef path;
  TaskInterface ti_local;
  string local_50 [32];
  string local_30 [32];
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  pBVar1 = this->node;
  this_00 = (BuildKey *)(pBVar1->super_Node).name._M_dataplus._M_p;
  pcVar2 = (char *)(pBVar1->super_Node).name._M_string_length;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else if ((this_00[-1].key.key.field_2._M_local_buf + 0xf)[(long)pcVar2] == '/') {
    if ((pcVar2 == (char *)0x1) && (*(char *)&(this_00->key).key._M_dataplus._M_p == '/')) {
      pcVar2 = (char *)0x1;
    }
    else {
      pcVar2 = pcVar2 + -1;
    }
  }
  path.Length = &pBVar1->exclusionPatterns;
  path.Data = pcVar2;
  llbuild::buildsystem::BuildKey::makeDirectoryTreeStructureSignature
            ((BuildKey *)local_50,this_00,path,in_R8);
  std::__cxx11::string::string(local_30,local_50);
  llbuild::core::TaskInterface::request(&ti_local,(KeyType *)local_30,0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Remove any trailing slash from the node name.
    StringRef path =  node.getName();
    if (path.endswith("/") && path != "/") {
      path = path.substr(0, path.size() - 1);
    }
    ti.request(BuildKey::makeDirectoryTreeStructureSignature(path,
                 node.contentExclusionPatterns()).toData(),
               /*inputID=*/0);
  }